

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O0

void __thiscall xmrig::Workers<xmrig::CudaLaunchData>::stop(Workers<xmrig::CudaLaunchData> *this)

{
  Thread<xmrig::CudaLaunchData> *pTVar1;
  bool bVar2;
  reference ppTVar3;
  Hashrate *in_RDI;
  Thread<xmrig::CudaLaunchData> *worker;
  iterator __end0;
  iterator __begin0;
  vector<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
  *__range1;
  vector<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
  *in_stack_ffffffffffffffb8;
  Thread<xmrig::CudaLaunchData> *in_stack_ffffffffffffffc0;
  uint64_t *puVar4;
  __normal_iterator<xmrig::Thread<xmrig::CudaLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>_>
  local_18;
  Hashrate *this_00;
  
  CudaLaunchData::backend();
  Nonce::stop(CPU);
  this_00 = in_RDI;
  local_18._M_current =
       (Thread<xmrig::CudaLaunchData> **)
       std::
       vector<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
       ::begin(in_stack_ffffffffffffffb8);
  std::
  vector<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
  ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<xmrig::Thread<xmrig::CudaLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<xmrig::Thread<xmrig::CudaLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar2) break;
    ppTVar3 = __gnu_cxx::
              __normal_iterator<xmrig::Thread<xmrig::CudaLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>_>
              ::operator*(&local_18);
    pTVar1 = *ppTVar3;
    if (pTVar1 != (Thread<xmrig::CudaLaunchData> *)0x0) {
      Thread<xmrig::CudaLaunchData>::~Thread(in_stack_ffffffffffffffc0);
      operator_delete(pTVar1);
    }
    __gnu_cxx::
    __normal_iterator<xmrig::Thread<xmrig::CudaLaunchData>_**,_std::vector<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>_>
    ::operator++(&local_18);
  }
  std::
  vector<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
  ::clear((vector<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
           *)0x1fa4ca);
  CudaLaunchData::backend();
  Nonce::touch(CPU);
  puVar4 = *in_RDI->m_timestamps;
  if (puVar4 != (uint64_t *)0x0) {
    Hashrate::~Hashrate(this_00);
    operator_delete(puVar4);
  }
  *in_RDI->m_timestamps = (uint64_t *)0x0;
  return;
}

Assistant:

void xmrig::Workers<T>::stop()
{
    Nonce::stop(T::backend());

    for (Thread<T> *worker : m_workers) {
        delete worker;
    }

    m_workers.clear();
    Nonce::touch(T::backend());

    delete d_ptr->hashrate;
    d_ptr->hashrate = nullptr;
}